

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O0

TimingControl *
slang::ast::SignalEventControl::fromExpr
          (Compilation *compilation,EdgeKind edge,Expression *expr,Expression *iffCondition,
          ASTContext *context,SourceRange sourceRange)

{
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  SourceRange sourceRange_04;
  SourceRange sourceRange_05;
  bool bVar1;
  byte bVar2;
  bitwidth_t bVar3;
  Symbol *pSVar4;
  TimingControl *pTVar5;
  long in_RCX;
  Expression *in_RDX;
  int in_ESI;
  ClockingEventExpression *cee;
  bool isClocking;
  Symbol *symRef;
  SignalEventControl *result;
  Expression *in_stack_00000270;
  ASTContext *in_stack_00000278;
  Type *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  Type *in_stack_fffffffffffffed8;
  SourceRange *in_stack_fffffffffffffee0;
  ASTContext *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  undefined1 uVar6;
  SourceLocation in_stack_fffffffffffffef8;
  BumpAllocator *in_stack_ffffffffffffff00;
  DiagCode code;
  undefined1 in_stack_ffffffffffffff17;
  Type *in_stack_ffffffffffffff18;
  Diagnostic *in_stack_ffffffffffffff20;
  Expression *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  TimingControl *in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffba;
  undefined1 in_stack_ffffffffffffffbe;
  SignalEventControl *local_8;
  
  local_8 = BumpAllocator::
            emplace<slang::ast::SignalEventControl,slang::ast::EdgeKind&,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::SourceRange&>
                      (in_stack_ffffffffffffff00,(EdgeKind *)in_stack_fffffffffffffef8,
                       (Expression *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                       (Expression **)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  code = SUB84((ulong)in_stack_ffffffffffffff00 >> 0x20,0);
  bVar1 = Expression::bad((Expression *)
                          CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  if (bVar1) {
    pTVar5 = TimingControl::badCtrl
                       ((Compilation *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0)
                        ,(TimingControl *)in_stack_fffffffffffffec8);
    return pTVar5;
  }
  pSVar4 = Expression::getSymbolReference
                     ((Expression *)in_stack_ffffffffffffff18,(bool)in_stack_ffffffffffffff17);
  if ((pSVar4 == (Symbol *)0x0) || (uVar6 = true, pSVar4->kind != ClockingBlock)) {
    uVar6 = in_RDX->kind == ClockingEvent;
  }
  bVar2 = uVar6;
  if (in_ESI == 0) {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x6ea791);
    bVar1 = Type::isAggregate(in_stack_fffffffffffffec8);
    if (!bVar1) {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x6ea7ae)
      ;
      bVar1 = Type::isPropertyType((Type *)0x6ea7b6);
      if (!bVar1) {
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x6ea7cb);
        bVar1 = Type::isVoid((Type *)0x6ea7d3);
        if ((!bVar1) || ((bVar2 & 1) != 0)) goto LAB_006eaa2f;
      }
    }
    sourceRange_00.startLoc._7_1_ = uVar6;
    sourceRange_00.startLoc._0_7_ = in_stack_fffffffffffffef0;
    sourceRange_00.endLoc = in_stack_fffffffffffffef8;
    ASTContext::addDiag(in_stack_fffffffffffffee8,code,sourceRange_00);
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x6ea851);
    ast::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    local_8 = (SignalEventControl *)
              TimingControl::badCtrl
                        ((Compilation *)
                         CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                         (TimingControl *)in_stack_fffffffffffffec8);
  }
  else {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x6ea896);
    bVar1 = Type::isIntegral((Type *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    if (!bVar1) {
      if ((bVar2 & 1) == 0) {
        sourceRange_02.startLoc._7_1_ = uVar6;
        sourceRange_02.startLoc._0_7_ = in_stack_fffffffffffffef0;
        sourceRange_02.endLoc = in_stack_fffffffffffffef8;
        ASTContext::addDiag(in_stack_fffffffffffffee8,code,sourceRange_02);
        not_null<const_slang::ast::Type_*>::operator*
                  ((not_null<const_slang::ast::Type_*> *)0x6ea96a);
        ast::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      else {
        sourceRange_01.startLoc._7_1_ = uVar6;
        sourceRange_01.startLoc._0_7_ = in_stack_fffffffffffffef0;
        sourceRange_01.endLoc = in_stack_fffffffffffffef8;
        ASTContext::addDiag(in_stack_fffffffffffffee8,code,sourceRange_01);
      }
      pTVar5 = TimingControl::badCtrl
                         ((Compilation *)
                          CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                          (TimingControl *)in_stack_fffffffffffffec8);
      return pTVar5;
    }
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x6ea9aa);
    bVar3 = Type::getBitWidth(in_stack_fffffffffffffed8);
    if (1 < bVar3) {
      sourceRange_03.startLoc._7_1_ = uVar6;
      sourceRange_03.startLoc._0_7_ = in_stack_fffffffffffffef0;
      sourceRange_03.endLoc = in_stack_fffffffffffffef8;
      ASTContext::addDiag(in_stack_fffffffffffffee8,code,sourceRange_03);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x6eaa1e);
      ast::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
LAB_006eaa2f:
    if (in_RCX != 0) {
      if ((bVar2 & 1) != 0) {
        in_stack_ffffffffffffff5c = 0xd0008;
        in_stack_ffffffffffffff50 = *(Expression **)(in_RCX + 0x28);
        sourceRange_04.startLoc._7_1_ = uVar6;
        sourceRange_04.startLoc._0_7_ = in_stack_fffffffffffffef0;
        sourceRange_04.endLoc = in_stack_fffffffffffffef8;
        ASTContext::addDiag(in_stack_fffffffffffffee8,code,sourceRange_04);
      }
      bVar1 = ASTContext::requireBooleanConvertible
                        ((ASTContext *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                         ,in_stack_ffffffffffffff50);
      if (!bVar1) {
        pTVar5 = TimingControl::badCtrl
                           ((Compilation *)
                            CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                            (TimingControl *)in_stack_fffffffffffffec8);
        return pTVar5;
      }
    }
    if (in_RDX->kind == ClockingEvent) {
      Expression::as<slang::ast::ClockingEventExpression>(in_RDX);
      local_8 = (SignalEventControl *)
                cloneClockingEvent((Compilation *)
                                   CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffbe,
                                                           CONCAT42(in_stack_ffffffffffffffba,
                                                                    in_stack_ffffffffffffffb8))),
                                   in_stack_ffffffffffffffb0);
    }
    else {
      ASTContext::tryEval(in_stack_00000278,in_stack_00000270);
      bVar2 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x6eab3f);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x6eab4f);
      if ((bVar2 & 1) != 0) {
        sourceRange_05.startLoc._7_1_ = uVar6;
        sourceRange_05.startLoc._0_7_ = in_stack_fffffffffffffef0;
        sourceRange_05.endLoc = (in_RDX->sourceRange).startLoc;
        ASTContext::addDiag(in_stack_fffffffffffffee8,SUB84((in_RDX->sourceRange).endLoc,4),
                            sourceRange_05);
      }
    }
  }
  return &local_8->super_TimingControl;
}

Assistant:

TimingControl& SignalEventControl::fromExpr(Compilation& compilation, EdgeKind edge,
                                            const Expression& expr, const Expression* iffCondition,
                                            const ASTContext& context, SourceRange sourceRange) {
    auto result = compilation.emplace<SignalEventControl>(edge, expr, iffCondition, sourceRange);
    if (expr.bad())
        return badCtrl(compilation, result);

    // Note: `expr` here can be a void-typed ArbitrarySymbolExpression if it's
    // referring to a clocking block.
    auto symRef = expr.getSymbolReference();
    const bool isClocking = (symRef && symRef->kind == SymbolKind::ClockingBlock) ||
                            expr.kind == ExpressionKind::ClockingEvent;

    if (edge == EdgeKind::None) {
        if (expr.type->isAggregate() || expr.type->isPropertyType() ||
            (expr.type->isVoid() && !isClocking)) {
            context.addDiag(diag::InvalidEventExpression, expr.sourceRange) << *expr.type;
            return badCtrl(compilation, result);
        }
    }
    else if (!expr.type->isIntegral()) {
        if (isClocking)
            context.addDiag(diag::ClockingBlockEventEdge, expr.sourceRange);
        else
            context.addDiag(diag::ExprMustBeIntegral, expr.sourceRange) << *expr.type;
        return badCtrl(compilation, result);
    }
    else if (expr.type->getBitWidth() > 1) {
        context.addDiag(diag::MultiBitEdge, expr.sourceRange) << *expr.type;
    }

    if (iffCondition) {
        if (isClocking)
            context.addDiag(diag::ClockingBlockEventIff, iffCondition->sourceRange);

        if (!context.requireBooleanConvertible(*iffCondition))
            return badCtrl(compilation, result);
    }

    // If our expression is a reference to another clocking event due to
    // a sequence or property argument expansion we need to unwrap to the
    // target timing control and use that instead.
    if (expr.kind == ExpressionKind::ClockingEvent) {
        auto& cee = expr.as<ClockingEventExpression>();
        return cloneClockingEvent(compilation, cee.timingControl);
    }

    // Warn if the expression is constant, since it'll never change to trigger off.
    if (context.tryEval(expr))
        context.addDiag(diag::EventExpressionConstant, expr.sourceRange);

    return *result;
}